

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_TestCaseBlockForIgnoredTest_Test::
~TEST_JUnitOutputTest_TestCaseBlockForIgnoredTest_Test
          (TEST_JUnitOutputTest_TestCaseBlockForIgnoredTest_Test *this)

{
  TEST_JUnitOutputTest_TestCaseBlockForIgnoredTest_Test *this_local;
  
  ~TEST_JUnitOutputTest_TestCaseBlockForIgnoredTest_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(JUnitOutputTest, TestCaseBlockForIgnoredTest)
{
   junitOutput->setPackageName("packagename");
   testCaseRunner->start()
      .withGroup("groupname").withIgnoredTest("testname")
      .end();

   outputFile = fileSystem.file("cpputest_packagename_groupname.xml");

   STRCMP_EQUAL("<testcase classname=\"packagename.groupname\" name=\"testname\" assertions=\"0\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
   STRCMP_EQUAL("<skipped />\n", outputFile->line(6));
   STRCMP_EQUAL("</testcase>\n", outputFile->line(7));
}